

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>::
     Assign<duckdb::string_t,duckdb::hugeint_t,duckdb::ArgMinMaxState<duckdb::string_t,duckdb::hugeint_t>>
               (ArgMinMaxState<duckdb::string_t,_duckdb::hugeint_t> *state,string_t *x,hugeint_t *y,
               bool x_null)

{
  string_t new_value;
  byte in_CL;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  hugeint_t new_value_00;
  undefined7 in_stack_ffffffffffffffe0;
  
  *(byte *)(in_RDI + 1) = in_CL & 1;
  if ((*(byte *)(in_RDI + 1) & 1) == 0) {
    new_value.value.pointer.ptr = (char *)in_RSI;
    new_value.value._0_8_ = in_RDX;
    ArgMinMaxStateBase::AssignValue<duckdb::string_t>
              ((string_t *)(CONCAT17(in_CL,in_stack_ffffffffffffffe0) & 0x1ffffffffffffff),new_value
              );
  }
  new_value_00.upper = (int64_t)*in_RDX;
  new_value_00.lower = in_RDX[1];
  ArgMinMaxStateBase::AssignValue<duckdb::hugeint_t>
            ((ArgMinMaxStateBase *)(in_RDI + 0x18),(hugeint_t *)*in_RDX,new_value_00);
  return;
}

Assistant:

static void Assign(STATE &state, const A_TYPE &x, const B_TYPE &y, const bool x_null) {
		if (IGNORE_NULL) {
			STATE::template AssignValue<A_TYPE>(state.arg, x);
			STATE::template AssignValue<B_TYPE>(state.value, y);
		} else {
			state.arg_null = x_null;
			if (!state.arg_null) {
				STATE::template AssignValue<A_TYPE>(state.arg, x);
			}
			STATE::template AssignValue<B_TYPE>(state.value, y);
		}
	}